

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O3

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pbrt::UniformGridMediumProvider::GetMaxDensityGrid
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__return_storage_ptr__,
          UniformGridMediumProvider *this,Allocator alloc,Point3i *res)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_000013c4 [12];
  Bounds3f bounds;
  undefined8 local_70;
  undefined4 local_68;
  undefined8 local_64;
  undefined4 local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  (res->super_Tuple3<pbrt::Point3,_int>).x = 0x10;
  (res->super_Tuple3<pbrt::Point3,_int>).y = 0x10;
  (res->super_Tuple3<pbrt::Point3,_int>).z = 0x10;
  (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
  __return_storage_ptr__->ptr = (float *)0x0;
  __return_storage_ptr__->nAlloc = 0;
  __return_storage_ptr__->nStored = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize
            (__return_storage_ptr__,0x1000);
  iVar6 = (res->super_Tuple3<pbrt::Point3,_int>).z;
  if (0 < iVar6) {
    lVar7 = 0;
    iVar5 = (res->super_Tuple3<pbrt::Point3,_int>).y;
    fVar9 = 0.0;
    do {
      fVar1 = fVar9 + 1.0;
      if (0 < iVar5) {
        iVar6 = (res->super_Tuple3<pbrt::Point3,_int>).x;
        fVar4 = 0.0;
        do {
          if (iVar6 < 1) {
            local_58._0_4_ = fVar4 + 1.0;
          }
          else {
            auVar8._0_4_ = (float)iVar6;
            auVar8._4_12_ = in_register_000013c4;
            lVar7 = (long)(int)lVar7;
            local_58 = ZEXT416((uint)(fVar4 + 1.0));
            local_48 = ZEXT816(0);
            do {
              auVar12._0_4_ = (float)(res->super_Tuple3<pbrt::Point3,_int>).y;
              auVar12._4_12_ = in_register_000013c4;
              auVar2 = vinsertps_avx(local_48,ZEXT416((uint)fVar4),0x10);
              auVar12 = vinsertps_avx(auVar8,auVar12,0x10);
              fVar11 = (float)(res->super_Tuple3<pbrt::Point3,_int>).z;
              local_48 = ZEXT416((uint)(local_48._0_4_ + 1.0));
              auVar8 = vdivps_avx(auVar2,auVar12);
              auVar2 = vinsertps_avx(local_48,ZEXT416((uint)local_58._0_4_),0x10);
              auVar2 = vdivps_avx(auVar2,auVar12);
              auVar13._0_4_ = fVar9 / fVar11;
              auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar10._0_4_ = fVar1 / fVar11;
              auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar12 = vminps_avx(auVar2,auVar8);
              auVar8 = vmaxps_avx(auVar2,auVar8);
              auVar3 = vminss_avx(auVar10,auVar13);
              auVar2 = vmaxss_avx(auVar10,auVar13);
              local_70 = vmovlps_avx(auVar12);
              local_68 = auVar3._0_4_;
              local_64 = vmovlps_avx(auVar8);
              local_5c = auVar2._0_4_;
              if ((this->densityGrid).set == true) {
                fVar11 = SampledGrid<float>::
                         MaxValue<pbrt::SampledGrid<float>::MaxValue(pbrt::Bounds3<float>const&)const::_lambda(float)_1_>
                                   ((SampledGrid<float> *)&this->densityGrid,&local_70);
              }
              else {
                if ((this->rgbDensityGrid).set == false) {
                  LogFatal<char_const(&)[4]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                             ,0xef,"Check failed: %s",(char (*) [4])0x280907c);
                }
                fVar11 = SampledGrid<pbrt::RGBUnboundedSpectrum>::operator()
                                   ((SampledGrid<pbrt::RGBUnboundedSpectrum> *)&this->rgbDensityGrid
                                    ,&local_70);
              }
              __return_storage_ptr__->ptr[lVar7] = fVar11;
              lVar7 = lVar7 + 1;
              iVar6 = (res->super_Tuple3<pbrt::Point3,_int>).x;
              auVar8._0_4_ = (float)iVar6;
              auVar8._4_12_ = in_register_000013c4;
            } while (local_48._0_4_ < auVar8._0_4_);
            iVar5 = (res->super_Tuple3<pbrt::Point3,_int>).y;
          }
          fVar4 = (float)local_58._0_4_;
        } while ((float)local_58._0_4_ < (float)iVar5);
        iVar6 = (res->super_Tuple3<pbrt::Point3,_int>).z;
      }
      fVar9 = fVar1;
    } while (fVar1 < (float)iVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::vector<Float> GetMaxDensityGrid(Allocator alloc, Point3i *res) const {
        // Set _gridResolution_ and allocate _maxGrid_
        *res = Point3i(16, 16, 16);
        pstd::vector<Float> maxGrid(alloc);
        maxGrid.resize(res->x * res->y * res->z);

        // Define _getMaxDensity_ lambda
        auto getMaxDensity = [&](const Bounds3f &bounds) -> Float {
            if (densityGrid)
                return densityGrid->MaxValue(bounds);
            else
                return rgbDensityGrid->MaxValue(
                    bounds,
                    [] PBRT_CPU_GPU(RGBUnboundedSpectrum s) { return s.MaxValue(); });
        };

        // Compute maximum density for each _maxGrid_ cell
        int offset = 0;
        for (Float z = 0; z < res->z; ++z)
            for (Float y = 0; y < res->y; ++y)
                for (Float x = 0; x < res->x; ++x) {
                    Bounds3f bounds(
                        Point3f(x / res->x, y / res->y, z / res->z),
                        Point3f((x + 1) / res->x, (y + 1) / res->y, (z + 1) / res->z));
                    maxGrid[offset++] = getMaxDensity(bounds);
                }

        return maxGrid;
    }